

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_titlecase_brkiter.cpp
# Opt level: O0

int32_t icu_63::CaseMap::toTitle
                  (char *locale,uint32_t options,BreakIterator *iter,UChar *src,int32_t srcLength,
                  UChar *dest,int32_t destCapacity,Edits *edits,UErrorCode *errorCode)

{
  int32_t caseLocale;
  BreakIterator *iter_00;
  ConstChar16Ptr local_a8;
  undefined1 local_a0 [8];
  UnicodeString s;
  LocalPointer<icu_63::BreakIterator> local_50;
  LocalPointer<icu_63::BreakIterator> ownedIter;
  UChar *dest_local;
  int32_t srcLength_local;
  UChar *src_local;
  BreakIterator *iter_local;
  uint32_t options_local;
  char *locale_local;
  
  ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr =
       (LocalPointerBase<icu_63::BreakIterator>)(LocalPointerBase<icu_63::BreakIterator>)dest;
  LocalPointer<icu_63::BreakIterator>::LocalPointer(&local_50,(BreakIterator *)0x0);
  iter_00 = ustrcase_getTitleBreakIterator_63((Locale *)0x0,locale,options,iter,&local_50,errorCode)
  ;
  if (iter_00 == (BreakIterator *)0x0) {
    locale_local._4_4_ = 0;
    s.fUnion._48_4_ = 1;
  }
  else {
    ConstChar16Ptr::ConstChar16Ptr(&local_a8,src);
    UnicodeString::UnicodeString
              ((UnicodeString *)local_a0,(byte)((uint)srcLength >> 0x1f),&local_a8,srcLength);
    ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
    (*(iter_00->super_UObject)._vptr_UObject[7])(iter_00,local_a0);
    caseLocale = ustrcase_getCaseLocale_63(locale);
    locale_local._4_4_ =
         ustrcase_map_63(caseLocale,options,iter_00,
                         (UChar *)ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr,
                         destCapacity,src,srcLength,ustrcase_internalToTitle_63,edits,errorCode);
    s.fUnion._48_4_ = 1;
    UnicodeString::~UnicodeString((UnicodeString *)local_a0);
  }
  LocalPointer<icu_63::BreakIterator>::~LocalPointer(&local_50);
  return locale_local._4_4_;
}

Assistant:

int32_t CaseMap::toTitle(
        const char *locale, uint32_t options, BreakIterator *iter,
        const UChar *src, int32_t srcLength,
        UChar *dest, int32_t destCapacity, Edits *edits,
        UErrorCode &errorCode) {
    LocalPointer<BreakIterator> ownedIter;
    iter = ustrcase_getTitleBreakIterator(nullptr, locale, options, iter, ownedIter, errorCode);
    if(iter==NULL) {
        return 0;
    }
    UnicodeString s(srcLength<0, src, srcLength);
    iter->setText(s);
    return ustrcase_map(
        ustrcase_getCaseLocale(locale), options, iter,
        dest, destCapacity,
        src, srcLength,
        ustrcase_internalToTitle, edits, errorCode);
}